

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O2

void __thiscall Printer_noChangeToManualIds_Test::TestBody(Printer_noChangeToManualIds_Test *this)

{
  char *pcVar1;
  AssertHelper aAStack_98 [8];
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  ModelPtr model;
  PrinterPtr printer;
  ParserPtr parser;
  string in;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&in,
             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"everything\" id=\"id_4da55\">\n  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"some-other-model.xml\" id=\"id_4da56\">\n    <component component_ref=\"a_component_in_that_model\" name=\"component1\" id=\"id_4da57\"/>\n  </import>\n  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"some-other-model.xml\" id=\"hello\">\n    <units units_ref=\"a_units_in_that_model\" name=\"units1\" id=\"id_4da59\"/>\n  </import>\n  <units name=\"units2\" id=\"id_4da5a\">\n    <unit units=\"second\" id=\"id_4da5b\"/>\n  </units>\n  <units name=\"units3\" id=\"id_4da5c\"/>\n  <units name=\"blob\" id=\"id_4da5d\"/>\n  <component name=\"component2\" id=\"id_4da5e\">\n    <variable name=\"variable1\" units=\"units2\" interface=\"private\" id=\"id_4da5f\"/>\n    <variable name=\"variable2\" units=\"units2\" id=\"id_4da60\"/>\n    <reset variable=\"variable1\" test_variable=\"variable2\" order=\"1\" id=\"id_4da61\">\n      <test_value id=\"id_4da62\">\n        <math xmlns=\"http://www.w3.org/1998/Math/MathML\" xmlns:cellml=\"http://www.cellml.org/cellml/2.0#\">\n          <apply>\n            <eq/>\n            <ci>variable1</ci>\n            <cn cellml:units=\"units2\">3.4</cn>\n          </apply>\n        </math>\n      </test_value>\n      <reset_value id=\"id_4da63\">\n        <math xmlns=\"http://www.w3.org/1998/Math/MathML\" xmlns:cellml=\"http://www.cellml.org/cellml/2.0#\">\n          <apply>\n            <eq/>\n            <ci>variable1</ci>\n            <cn cellml:units=\"units2\">9.0</cn>\n          </apply>\n        </math>\n      </reset_value>\n    </reset>\n  </component>\n  <component name=\"component3\" id=\"id_4da64\">\n    <variable name=\"variable4\" units=\"units2\" interface=\"public\" id=\"id_4da65\"/>\n    <variable name=\"variable2\" units=\"units2\" interface=\"public\" id=\"id_4da66\"/>\n    <math xmlns=\"http://www.w3.org/1998/Math/MathML\" xmlns:cellml=\"http://www.cellml.org/cellml/2.0#\">\n      <apply>\n        <eq/>\n        <ci>variable4</ci>\n        <cn cellml:units=\"units2\">9.0</cn>\n      </apply>\n    </math>\n  </component..." /* TRUNCATED STRING LITERAL */
             ,(allocator<char> *)&local_80);
  libcellml::Parser::create(SUB81(&parser,0));
  libcellml::Parser::parseModel((string *)&model);
  libcellml::Printer::create();
  libcellml::Printer::printModel_abi_cxx11_
            ((shared_ptr *)&local_80,
             (bool)printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   ._0_1_);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"in","printer->printModel(model, true)",&in,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_80);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (aAStack_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/printer/printer.cpp"
               ,0x327,pcVar1);
    testing::internal::AssertHelper::operator=(aAStack_98,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(aAStack_98);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_80);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&in);
  return;
}

Assistant:

TEST(Printer, noChangeToManualIds)
{
    // This test is for coverage.  All entities have identifiers already, no change to the printed model.
    const std::string in = "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
                           "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"everything\" id=\"id_4da55\">\n"
                           "  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"some-other-model.xml\" id=\"id_4da56\">\n"
                           "    <component component_ref=\"a_component_in_that_model\" name=\"component1\" id=\"id_4da57\"/>\n"
                           "  </import>\n"
                           "  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"some-other-model.xml\" id=\"hello\">\n"
                           "    <units units_ref=\"a_units_in_that_model\" name=\"units1\" id=\"id_4da59\"/>\n"
                           "  </import>\n"
                           "  <units name=\"units2\" id=\"id_4da5a\">\n"
                           "    <unit units=\"second\" id=\"id_4da5b\"/>\n"
                           "  </units>\n"
                           "  <units name=\"units3\" id=\"id_4da5c\"/>\n"
                           "  <units name=\"blob\" id=\"id_4da5d\"/>\n"
                           "  <component name=\"component2\" id=\"id_4da5e\">\n"
                           "    <variable name=\"variable1\" units=\"units2\" interface=\"private\" id=\"id_4da5f\"/>\n"
                           "    <variable name=\"variable2\" units=\"units2\" id=\"id_4da60\"/>\n"
                           "    <reset variable=\"variable1\" test_variable=\"variable2\" order=\"1\" id=\"id_4da61\">\n"
                           "      <test_value id=\"id_4da62\">\n"
                           "        <math xmlns=\"http://www.w3.org/1998/Math/MathML\" xmlns:cellml=\"http://www.cellml.org/cellml/2.0#\">\n"
                           "          <apply>\n"
                           "            <eq/>\n"
                           "            <ci>variable1</ci>\n"
                           "            <cn cellml:units=\"units2\">3.4</cn>\n"
                           "          </apply>\n"
                           "        </math>\n"
                           "      </test_value>\n"
                           "      <reset_value id=\"id_4da63\">\n"
                           "        <math xmlns=\"http://www.w3.org/1998/Math/MathML\" xmlns:cellml=\"http://www.cellml.org/cellml/2.0#\">\n"
                           "          <apply>\n"
                           "            <eq/>\n"
                           "            <ci>variable1</ci>\n"
                           "            <cn cellml:units=\"units2\">9.0</cn>\n"
                           "          </apply>\n"
                           "        </math>\n"
                           "      </reset_value>\n"
                           "    </reset>\n"
                           "  </component>\n"
                           "  <component name=\"component3\" id=\"id_4da64\">\n"
                           "    <variable name=\"variable4\" units=\"units2\" interface=\"public\" id=\"id_4da65\"/>\n"
                           "    <variable name=\"variable2\" units=\"units2\" interface=\"public\" id=\"id_4da66\"/>\n"
                           "    <math xmlns=\"http://www.w3.org/1998/Math/MathML\" xmlns:cellml=\"http://www.cellml.org/cellml/2.0#\">\n"
                           "      <apply>\n"
                           "        <eq/>\n"
                           "        <ci>variable4</ci>\n"
                           "        <cn cellml:units=\"units2\">9.0</cn>\n"
                           "      </apply>\n"
                           "    </math>\n"
                           "  </component>\n"
                           "  <connection component_1=\"component2\" component_2=\"component3\" id=\"id_4da6b\">\n"
                           "    <map_variables variable_1=\"variable1\" variable_2=\"variable2\" id=\"id_4da69\"/>\n"
                           "    <map_variables variable_1=\"variable1\" variable_2=\"variable4\" id=\"id_4da6a\"/>\n"
                           "  </connection>\n"
                           "  <encapsulation id=\"id_4da6c\">\n"
                           "    <component_ref component=\"component2\" id=\"id_4da67\">\n"
                           "      <component_ref component=\"component3\" id=\"id_4da68\"/>\n"
                           "    </component_ref>\n"
                           "  </encapsulation>\n"
                           "</model>\n";

    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(in);
    auto printer = libcellml::Printer::create();
    EXPECT_EQ(in, printer->printModel(model, true));
}